

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Pass * __thiscall asmjit::_abi_1_10::BaseBuilder::passByName(BaseBuilder *this,char *name)

{
  uint uVar1;
  void *pvVar2;
  Pass *pPVar3;
  int iVar4;
  long lVar5;
  
  pvVar2 = (this->_passes).super_ZoneVectorBase._data;
  uVar1 = (this->_passes).super_ZoneVectorBase._size;
  lVar5 = 0;
  do {
    if ((ulong)uVar1 << 3 == lVar5) {
      return (Pass *)0x0;
    }
    pPVar3 = *(Pass **)((long)pvVar2 + lVar5);
    iVar4 = strcmp(pPVar3->_name,name);
    lVar5 = lVar5 + 8;
  } while (iVar4 != 0);
  return pPVar3;
}

Assistant:

ASMJIT_FAVOR_SIZE Pass* BaseBuilder::passByName(const char* name) const noexcept {
  for (Pass* pass : _passes)
    if (strcmp(pass->name(), name) == 0)
      return pass;
  return nullptr;
}